

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O0

state_status_t
tchecker::zg::initialize
          (system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,zone_sptr_t *zone,
          vedge_sptr_t *vedge,sync_id_t *sync_id,clock_constraint_container_t *invariant,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *attributes)

{
  clock_id_t dim_00;
  status_t sVar1;
  clock_variables_t *clocks;
  mapped_type *str;
  zone_t *pzVar2;
  db_t *dbm_00;
  size_t sVar3;
  status_t zone_status;
  clock_id_t dim;
  db_t *dbm;
  key_type local_90;
  undefined1 local_60 [8];
  clock_constraint_container_t clk_constraints;
  state_status_t state_status;
  sync_id_t *sync_id_local;
  vedge_sptr_t *vedge_local;
  zone_sptr_t *zone_local;
  intval_sptr_t *intval_local;
  vloc_sptr_t *vloc_local;
  system_t *system_local;
  
  clk_constraints.
  super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       ta::initialize(system,vloc,intval,vedge,sync_id,invariant,attributes);
  system_local._4_4_ =
       clk_constraints.
       super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  if (clk_constraints.
      super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 1) {
    std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::vector
              ((vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                *)local_60);
    clocks = tchecker::system::clocks_t::clock_variables((clocks_t *)system);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"zone",(allocator<char> *)((long)&dbm + 7));
    str = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::at(attributes,&local_90);
    from_string((clock_constraint_container_t *)local_60,clocks,str);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)((long)&dbm + 7));
    pzVar2 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
              ::operator->(zone)->super_zone_t;
    dbm_00 = zone_t::dbm(pzVar2);
    pzVar2 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
              ::operator->(zone)->super_zone_t;
    sVar3 = zone_t::dim(pzVar2);
    dim_00 = (clock_id_t)sVar3;
    tchecker::dbm::universal_positive(dbm_00,dim_00);
    sVar1 = tchecker::dbm::constrain(dbm_00,dim_00,(clock_constraint_container_t *)local_60);
    if (sVar1 == EMPTY) {
      system_local._4_4_ = 0x4000;
    }
    else {
      sVar1 = tchecker::dbm::constrain(dbm_00,dim_00,invariant);
      if (sVar1 == EMPTY) {
        system_local._4_4_ = 0x80;
      }
      else {
        system_local._4_4_ = 1;
      }
    }
    dbm._0_4_ = 1;
    std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::
    ~vector((vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_> *)
            local_60);
  }
  return system_local._4_4_;
}

Assistant:

tchecker::state_status_t initialize(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                                    tchecker::intval_sptr_t const & intval, tchecker::zg::zone_sptr_t const & zone,
                                    tchecker::vedge_sptr_t const & vedge, tchecker::sync_id_t & sync_id,
                                    tchecker::clock_constraint_container_t & invariant,
                                    std::map<std::string, std::string> const & attributes)
{
  // initialize vloc, intval and vedge from ta
  auto state_status = tchecker::ta::initialize(system, vloc, intval, vedge, sync_id, invariant, attributes);
  if (state_status != STATE_OK)
    return state_status;

  // initialize zone from attributes["zone"]
  tchecker::clock_constraint_container_t clk_constraints;
  try {
    tchecker::from_string(clk_constraints, system.clock_variables(), attributes.at("zone"));
  }
  catch (...) {
    return tchecker::STATE_BAD;
  }

  tchecker::dbm::db_t * dbm = zone->dbm();
  tchecker::clock_id_t const dim = zone->dim();
  tchecker::dbm::universal_positive(dbm, dim);
  tchecker::dbm::status_t zone_status = tchecker::dbm::constrain(dbm, dim, clk_constraints);
  if (zone_status == tchecker::dbm::EMPTY)
    return tchecker::STATE_BAD;

  // Apply invariant
  zone_status = tchecker::dbm::constrain(dbm, dim, invariant);
  if (zone_status == tchecker::dbm::EMPTY)
    return tchecker::STATE_CLOCKS_SRC_INVARIANT_VIOLATED;

  return tchecker::STATE_OK;
}